

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_particles.cxx
# Opt level: O0

void __thiscall level_tools::reconstruct_particles(level_tools *this)

{
  xr_custom_object *pxVar1;
  bool bVar2;
  xr_level_ps_static *pxVar3;
  particle_data_vec *this_00;
  xr_scene_objects *this_01;
  xr_custom_object_vec *this_02;
  size_type __n;
  reference pppVar4;
  xr_particle_object *this_03;
  char *pcVar5;
  string *psVar6;
  fvector3 *pfVar7;
  float _x;
  float _y;
  float _z;
  xr_particle_object *local_68 [3];
  xr_particle_object *local_50;
  xr_particle_object *new_ps;
  particle_data *ps;
  particle_data_vec_cit end;
  particle_data_vec_cit it;
  xr_name_gen name;
  xr_custom_object_vec *cobjects;
  particle_data_vec *particles;
  level_tools *this_local;
  
  pxVar3 = xray_re::xr_level::ps_static(this->m_level);
  if (pxVar3 != (xr_level_ps_static *)0x0) {
    xray_re::msg("building %s","ps.part");
    pxVar3 = xray_re::xr_level::ps_static(this->m_level);
    this_00 = xray_re::xr_level_ps_static::particles(pxVar3);
    this_01 = &xray_re::xr_scene::particles(this->m_scene)->super_xr_scene_objects;
    this_02 = xray_re::xr_scene_objects::objects(this_01);
    __n = std::vector<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>::size
                    (this_00);
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_02,__n);
    xray_re::xr_name_gen::xr_name_gen((xr_name_gen *)&it,"ps",true);
    end._M_current =
         (particle_data **)
         std::vector<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>::begin
                   (this_00);
    ps = (particle_data *)
         std::vector<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>::end
                   (this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&end,(__normal_iterator<xray_re::particle_data_*const_*,_std::vector<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>_>
                                    *)&ps), bVar2) {
      pppVar4 = __gnu_cxx::
                __normal_iterator<xray_re::particle_data_*const_*,_std::vector<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>_>
                ::operator*(&end);
      new_ps = (xr_particle_object *)*pppVar4;
      this_03 = (xr_particle_object *)operator_new(0x90);
      xray_re::xr_particle_object::xr_particle_object(this_03,this->m_scene);
      local_50 = this_03;
      pcVar5 = xray_re::xr_name_gen::get((xr_name_gen *)&it);
      psVar6 = xray_re::xr_custom_object::co_name_abi_cxx11_(&local_50->super_xr_custom_object);
      std::__cxx11::string::operator=((string *)psVar6,pcVar5);
      pfVar7 = xray_re::xr_custom_object::co_position(&local_50->super_xr_custom_object);
      xray_re::_vector3<float>::set<float>
                (pfVar7,(_vector3<float> *)
                        ((long)&(new_ps->super_xr_custom_object).m_scale.field_0 + 8));
      pxVar1 = &new_ps->super_xr_custom_object;
      pfVar7 = xray_re::xr_custom_object::co_rotation(&local_50->super_xr_custom_object);
      xray_re::_matrix<float>::get_xyz((_matrix<float> *)&(pxVar1->m_name).field_2,pfVar7);
      pfVar7 = xray_re::xr_custom_object::co_scale(&local_50->super_xr_custom_object);
      _x = xray_re::_vector3<float>::magnitude
                     ((_vector3<float> *)&(new_ps->super_xr_custom_object).m_name.field_2);
      _y = xray_re::_vector3<float>::magnitude(&(new_ps->super_xr_custom_object).m_position);
      _z = xray_re::_vector3<float>::magnitude
                     ((_vector3<float> *)
                      ((long)&(new_ps->super_xr_custom_object).m_rotation.field_0 + 4));
      xray_re::_vector3<float>::set(pfVar7,_x,_y,_z);
      pxVar1 = &new_ps->super_xr_custom_object;
      psVar6 = xray_re::xr_particle_object::reference_abi_cxx11_(local_50);
      std::__cxx11::string::operator=((string *)psVar6,(string *)&pxVar1->m_scene);
      local_68[0] = local_50;
      std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
      push_back(this_02,(value_type *)local_68);
      __gnu_cxx::
      __normal_iterator<xray_re::particle_data_*const_*,_std::vector<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>_>
      ::operator++(&end);
      xray_re::xr_name_gen::next((xr_name_gen *)&it);
    }
    xray_re::xr_level::clear_ps_static(this->m_level);
    xray_re::xr_name_gen::~xr_name_gen((xr_name_gen *)&it);
  }
  return;
}

Assistant:

void level_tools::reconstruct_particles()
{
	if (m_level->ps_static() == 0)
		return;
	msg("building %s", "ps.part");

	const particle_data_vec& particles = m_level->ps_static()->particles();

	xr_custom_object_vec& cobjects = m_scene->particles()->objects();
	cobjects.reserve(particles.size());

	xr_name_gen name("ps");
	for (particle_data_vec_cit it = particles.begin(), end = particles.end(); it != end; ++it, name.next()) {
		particle_data* ps = *it;
		xr_particle_object* new_ps = new xr_particle_object(*m_scene);
		new_ps->co_name() = name.get();
		new_ps->co_position().set(ps->xform.c);
		ps->xform.get_xyz(new_ps->co_rotation());
		// FIXME: this is not correct
		new_ps->co_scale().set(ps->xform.i.magnitude(),
				ps->xform.j.magnitude(), ps->xform.k.magnitude());
		new_ps->reference() = ps->reference;
		cobjects.push_back(new_ps);
	}
	m_level->clear_ps_static();
}